

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O2

void * __thiscall tinyxml2::MemPoolT<120>::Alloc(MemPoolT<120> *this)

{
  int iVar1;
  int iVar2;
  Item *t;
  Item *pIVar3;
  long lVar4;
  bool bVar5;
  
  t = this->_root;
  if (t == (Item *)0x0) {
    t = (Item *)operator_new(0xff0);
    memset(t,0,0xff0);
    DynArray<tinyxml2::MemPoolT<120>::Block_*,_10>::Push(&this->_blockPtrs,(Block *)t);
    lVar4 = 0x21;
    pIVar3 = t;
    while( true ) {
      bVar5 = lVar4 == 0;
      lVar4 = lVar4 + -1;
      if (bVar5) break;
      pIVar3->next = pIVar3 + 1;
      pIVar3 = pIVar3 + 1;
    }
    t[0x21].next = (Item *)0x0;
    this->_root = t;
  }
  this->_root = t->next;
  iVar2 = this->_currentAllocs;
  iVar1 = iVar2 + 1;
  this->_currentAllocs = iVar1;
  if (this->_maxAllocs <= iVar2) {
    this->_maxAllocs = iVar1;
  }
  this->_nAllocs = this->_nAllocs + 1;
  this->_nUntracked = this->_nUntracked + 1;
  return t;
}

Assistant:

virtual void* Alloc()
    {
        if (!_root) {
            // Need a new block.
            Block* block = new Block();
            _blockPtrs.Push(block);

            Item* blockItems = block->items;
            for (int i = 0; i < ITEMS_PER_BLOCK - 1; ++i) {
                blockItems[i].next = &(blockItems[i + 1]);
            }
            blockItems[ITEMS_PER_BLOCK - 1].next = 0;
            _root = blockItems;
        }
        Item* const result = _root;
        TIXMLASSERT(result != 0);
        _root = _root->next;

        ++_currentAllocs;
        if (_currentAllocs > _maxAllocs) {
            _maxAllocs = _currentAllocs;
        }
        ++_nAllocs;
        ++_nUntracked;
        return result;
    }